

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# valve.cpp
# Opt level: O2

void __thiscall Valve::validateStatus(Valve *this,Network *nw,double qTol)

{
  double *pdVar1;
  ostream *poVar2;
  
  if ((this->valveType < FCV) &&
     (pdVar1 = &(this->super_Link).flow, *pdVar1 <= -qTol && -qTol != *pdVar1)) {
    poVar2 = std::operator<<((ostream *)&nw->msgLog,"\nValve ");
    poVar2 = std::operator<<(poVar2,(string *)&(this->super_Link).super_Element.name);
    std::operator<<(poVar2," flow = ");
    std::ostream::_M_insert<double>((this->super_Link).flow * (nw->units).factors[5]);
    return;
  }
  return;
}

Assistant:

void Valve::validateStatus(Network* nw, double qTol)
{
    switch (valveType)
    {
    case PRV:
    case PSV:
        if (flow < -qTol)
        {
            nw->msgLog << "\nValve " << name << " flow = " << flow*nw->ucf(Units::FLOW);
        }
        break;

    default: break;
    }
}